

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void log_secret(ptls_t *tls,char *type,ptls_iovec_t secret)

{
  byte bVar1;
  st_ptls_log_event_t *psVar2;
  _func_void_st_ptls_log_event_t_ptr_ptls_t_ptr_char_ptr_char_ptr_varargs *p_Var3;
  char *pcVar4;
  size_t sVar5;
  char hexbuf [129];
  char local_a8 [144];
  
  psVar2 = tls->ctx->log_event;
  if (psVar2 != (st_ptls_log_event_t *)0x0) {
    pcVar4 = local_a8;
    p_Var3 = psVar2->cb;
    if (secret.len != 0) {
      sVar5 = 0;
      pcVar4 = local_a8;
      do {
        bVar1 = secret.base[sVar5];
        *pcVar4 = "0123456789abcdef"[bVar1 >> 4];
        pcVar4[1] = "0123456789abcdef"[bVar1 & 0xf];
        pcVar4 = pcVar4 + 2;
        sVar5 = sVar5 + 1;
      } while (secret.len != sVar5);
    }
    *pcVar4 = '\0';
    (*p_Var3)(psVar2,tls,type,"%s",local_a8);
  }
  return;
}

Assistant:

static void log_secret(ptls_t *tls, const char *type, ptls_iovec_t secret)
{
    char hexbuf[PTLS_MAX_DIGEST_SIZE * 2 + 1];

    PTLS_PROBE(NEW_SECRET, tls, type, ptls_hexdump(hexbuf, secret.base, secret.len));

    if (tls->ctx->log_event != NULL)
        tls->ctx->log_event->cb(tls->ctx->log_event, tls, type, "%s", ptls_hexdump(hexbuf, secret.base, secret.len));
}